

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_string_append(archive_string *as,char *p,size_t s)

{
  archive_string *paVar1;
  size_t in_RDX;
  archive_string *in_RSI;
  archive_string *in_RDI;
  archive_string *local_8;
  
  paVar1 = archive_string_ensure(in_RSI,in_RDX);
  if (paVar1 == (archive_string *)0x0) {
    local_8 = (archive_string *)0x0;
  }
  else {
    memcpy(in_RDI->s + in_RDI->length,in_RSI,in_RDX);
    in_RDI->length = in_RDX + in_RDI->length;
    in_RDI->s[in_RDI->length] = '\0';
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

static struct archive_string *
archive_string_append(struct archive_string *as, const char *p, size_t s)
{
	if (archive_string_ensure(as, as->length + s + 1) == NULL)
		return (NULL);
	memcpy(as->s + as->length, p, s);
	as->length += s;
	as->s[as->length] = 0;
	return (as);
}